

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::AdjustRegion
          (BamStandardIndex *this,BamRegion *region,uint32_t *begin,uint32_t *end)

{
  int iVar1;
  RefVector *this_00;
  const_reference pvVar2;
  BamException *this_01;
  uint32_t uVar3;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  
  this_00 = BamReaderPrivate::GetReferenceData((this->super_BamIndex).m_reader);
  iVar1 = region->LeftPosition;
  pvVar2 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                     (this_00,(long)region->LeftRefID);
  if (iVar1 < pvVar2->RefLength) {
    *begin = region->LeftPosition;
    uVar3 = region->RightPosition;
    if (((int)uVar3 < 1 || region->RightRefID < 0) || region->LeftRefID != region->RightRefID) {
      pvVar2 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                         (this_00,(long)region->LeftRefID);
      uVar3 = pvVar2->RefLength;
    }
    *end = uVar3;
    return;
  }
  this_01 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_48,"BamStandardIndex::AdjustRegion",&local_69);
  std::__cxx11::string::string((string *)&local_68,"invalid region requested",&local_6a);
  BamException::BamException(this_01,&local_48,&local_68);
  __cxa_throw(this_01,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::AdjustRegion(const BamRegion& region, uint32_t& begin, uint32_t& end)
{

    // retrieve references from reader
    const RefVector& references = m_reader->GetReferenceData();

    // LeftPosition cannot be greater than or equal to reference length
    if (region.LeftPosition >= references.at(region.LeftRefID).RefLength)
        throw BamException("BamStandardIndex::AdjustRegion", "invalid region requested");

    // set region 'begin'
    begin = (unsigned int)region.LeftPosition;

    // if right bound specified AND left&right bounds are on same reference
    // OK to use right bound position as region 'end'
    if (region.isRightBoundSpecified() && (region.LeftRefID == region.RightRefID))
        end = (unsigned int)region.RightPosition;

    // otherwise, set region 'end' to last reference base
    else
        end = (unsigned int)references.at(region.LeftRefID).RefLength;
}